

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printString(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  char *s;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  emit(this,'\"');
  pRVar1 = Ref::operator[](&local_28,1);
  s = cashew::Value::getCString(pRVar1->inst);
  emit(this,s);
  emit(this,'\"');
  return;
}

Assistant:

void printString(Ref node) {
    emit('"');
    emit(node[1]->getCString());
    emit('"');
  }